

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::addWordNgrams
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *hashes,int32_t n)

{
  size_type sVar1;
  const_reference pvVar2;
  Dictionary *this_00;
  Dictionary *pDVar3;
  int in_ECX;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 in_RSI;
  int32_t j;
  uint64_t h;
  int32_t i;
  int32_t id;
  vector<int,_std::allocator<int>_> *hashes_00;
  int local_2c;
  vector<int,_std::allocator<int>_> *local_28;
  int local_20;
  
  for (local_20 = 0; sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDX),
      (ulong)(long)local_20 < sVar1; local_20 = local_20 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_20);
    local_28 = (vector<int,_std::allocator<int>_> *)(long)*pvVar2;
    local_2c = local_20;
    while( true ) {
      local_2c = local_2c + 1;
      this_00 = (Dictionary *)(long)local_2c;
      pDVar3 = (Dictionary *)std::vector<int,_std::allocator<int>_>::size(in_RDX);
      if (pDVar3 <= this_00 || local_20 + in_ECX <= local_2c) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_2c);
      local_28 = (vector<int,_std::allocator<int>_> *)((long)local_28 * 0x6eac5db + (long)*pvVar2);
      hashes_00 = local_28;
      id = (int32_t)((ulong)in_RSI >> 0x20);
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x173e32);
      pushHash(this_00,hashes_00,id);
    }
  }
  return;
}

Assistant:

void Dictionary::addWordNgrams(
    std::vector<int32_t>& line,
    const std::vector<int32_t>& hashes,
    int32_t n) const {
  for (int32_t i = 0; i < hashes.size(); i++) {
    uint64_t h = hashes[i];
    for (int32_t j = i + 1; j < hashes.size() && j < i + n; j++) {
      h = h * 116049371 + hashes[j];
      pushHash(line, h % args_->bucket);
    }
  }
}